

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

bool QFileSystemEngine::fillMetaData
               (QFileSystemEntry *entry,QFileSystemMetaData *data,MetaDataFlags what)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  anon_class_32_4_8c4370f3 local_188;
  int entryErrno;
  QArrayDataPointer<char> local_158;
  MetaDataFlags what_local;
  anon_union_256_2_7f119113 anon_var_0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  what_local = what;
  bVar2 = QFileSystemEntry::isEmpty(entry);
  if ((bVar2) || (bVar2 = qIsFilenameBroken(entry), bVar2)) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    bVar2 = false;
    goto LAB_00129cc0;
  }
  if (((uint)what.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x72a67077) != 0) {
    what.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
         ((uint)what.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i | 0x72a67077);
    what_local.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         what.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
         super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
  }
  (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
       (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i &
       ~(uint)what.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
              super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
  local_158.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_158.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_158.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::nativeFilePath((NativePath *)&local_158,entry);
  entryErrno = 0;
  memset(&anon_var_0,0xaa,0x100);
  if (((uint)what.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i >> 0x10 & 1) == 0) {
    if (((uint)what.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
               super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x72a67077) != 0) {
LAB_00129b09:
      (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
      super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
           (data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
           super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x8d598f88;
      pcVar5 = local_158.ptr;
      if (local_158.ptr == (char *)0x0) {
        pcVar5 = "";
      }
      iVar3 = qt_real_statx(-100,pcVar5,0,&anon_var_0.statxBuffer);
      if (iVar3 == 0) {
        QFileSystemMetaData::fillFromStatxBuf(data,&anon_var_0.statxBuffer);
      }
      else {
        if (iVar3 == -0x26) {
          pcVar5 = local_158.ptr;
          if (local_158.ptr == (char *)0x0) {
            pcVar5 = "";
          }
          iVar3 = stat64(pcVar5,(stat64 *)&anon_var_0.statBuffer);
          if (iVar3 == 0) {
            QFileSystemMetaData::fillFromStatBuf(data,&anon_var_0.statBuffer);
            goto LAB_00129ba5;
          }
        }
LAB_00129b58:
        piVar4 = __errno_location();
        entryErrno = *piVar4;
        data->birthTime_ = 0;
        data->metadataChangeTime_ = 0;
        data->size_ = 0;
        data->accessTime_ = 0;
        data->modificationTime_ = 0;
        data->userId_ = 0xfffffffe;
        data->groupId_ = 0xfffffffe;
        (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
        super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
             (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i | 0x72e67077;
      }
    }
  }
  else {
    pcVar5 = local_158.ptr;
    if (local_158.ptr == (char *)0x0) {
      pcVar5 = "";
    }
    iVar3 = qt_real_statx(-100,pcVar5,0x100,&anon_var_0.statxBuffer);
    if (iVar3 == 0) {
      anon_var_0.statBuffer.st_mode = (__mode_t)anon_var_0.statxBuffer.stx_mode;
      iVar3 = 1;
LAB_00129ab5:
      if ((anon_var_0.statBuffer.st_mode & 0xf000) != 0xa000) goto LAB_00129acb;
      pbVar1 = (byte *)((long)&(data->entryFlags).
                               super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                               super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
      *pbVar1 = *pbVar1 | 1;
      iVar3 = -1;
LAB_00129ae7:
      bVar2 = true;
    }
    else {
      if (iVar3 == -0x26) {
        pcVar5 = local_158.ptr;
        if (local_158.ptr == (char *)0x0) {
          pcVar5 = "";
        }
        iVar3 = lstat64(pcVar5,(stat64 *)&anon_var_0.statBuffer);
        if (iVar3 == 0) {
          iVar3 = 0;
          goto LAB_00129ab5;
        }
      }
      if (-1 < iVar3) {
LAB_00129acb:
        if (iVar3 == 0) {
          QFileSystemMetaData::fillFromStatBuf(data,&anon_var_0.statBuffer);
          iVar3 = 0;
        }
        else {
          QFileSystemMetaData::fillFromStatxBuf(data,&anon_var_0.statxBuffer);
        }
        goto LAB_00129ae7;
      }
      piVar4 = __errno_location();
      entryErrno = *piVar4;
      pbVar1 = (byte *)((long)&(data->knownFlagsMask).
                               super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                               super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
      *pbVar1 = *pbVar1 | 0x40;
      bVar2 = entryErrno == 0;
    }
    pbVar1 = (byte *)((long)&(data->knownFlagsMask).
                             super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
    *pbVar1 = *pbVar1 | 1;
    if (((uint)what.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
               super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x72a67077) != 0 &&
        iVar3 == -1) {
      if (bVar2) goto LAB_00129b09;
      goto LAB_00129b58;
    }
  }
LAB_00129ba5:
  if (((uint)what.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x400700) != 0) {
    local_188.entryErrno = &entryErrno;
    local_188.what = &what_local;
    local_188.nativeFilePath = (QByteArray *)&local_158;
    local_188.data = data;
    fillMetaData::anon_class_32_4_8c4370f3::operator()(&local_188,UserReadPermission,4);
    fillMetaData::anon_class_32_4_8c4370f3::operator()(&local_188,UserWritePermission,2);
    fillMetaData::anon_class_32_4_8c4370f3::operator()(&local_188,UserExecutePermission,1);
    if ((entryErrno == 0) &&
       (((data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
         super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x400000) == 0)) {
      pcVar5 = local_158.ptr;
      if (local_158.ptr == (char *)0x0) {
        pcVar5 = "";
      }
      iVar3 = access(pcVar5,0);
      if (iVar3 == -1) {
        piVar4 = __errno_location();
        entryErrno = *piVar4;
      }
      else {
        pbVar1 = (byte *)((long)&(data->entryFlags).
                                 super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                                 super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
        *pbVar1 = *pbVar1 | 0x40;
      }
    }
    (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (uint)what_local.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
               super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x700 |
         (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
         super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i | 0x400000;
    what.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         what_local.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
         super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
  }
  if ((((uint)what.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
              super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i >> 0x14 & 1) != 0) &&
     (((data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x100000) == 0)) {
    local_188.nativeFilePath = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    local_188.entryErrno = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_188.what = (MetaDataFlags *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::fileName((QString *)&local_188,entry);
    bVar2 = QString::startsWith((QString *)&local_188,(QChar)0x2e,CaseSensitive);
    if (bVar2) {
      pbVar1 = (byte *)((long)&(data->entryFlags).
                               super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                               super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
      *pbVar1 = *pbVar1 | 0x10;
    }
    pbVar1 = (byte *)((long)&(data->knownFlagsMask).
                             super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
    *pbVar1 = *pbVar1 | 0x10;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_188);
  }
  bVar2 = entryErrno == 0;
  if (!bVar2) {
    what_local.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
         ((uint)what_local.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0xfffeffff);
    (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
         super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i &
         ~(uint)what_local.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_158);
LAB_00129cc0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QFileSystemEngine::fillMetaData(const QFileSystemEntry &entry, QFileSystemMetaData &data,
        QFileSystemMetaData::MetaDataFlags what)
{
    Q_CHECK_FILE_NAME(entry, false);

#if defined(Q_OS_DARWIN)
    if (what & (QFileSystemMetaData::BundleType | QFileSystemMetaData::CaseSensitive)) {
        if (!data.hasFlags(QFileSystemMetaData::DirectoryType))
            what |= QFileSystemMetaData::DirectoryType;
    }
    if (what & QFileSystemMetaData::AliasType)
        what |= QFileSystemMetaData::LinkType;
#endif
#ifdef UF_HIDDEN
    if (what & QFileSystemMetaData::HiddenAttribute) {
        // OS X >= 10.5: st_flags & UF_HIDDEN
        what |= QFileSystemMetaData::PosixStatFlags;
    }
#endif // defined(Q_OS_DARWIN)

    // if we're asking for any of the stat(2) flags, then we're getting them all
    if (what & QFileSystemMetaData::PosixStatFlags)
        what |= QFileSystemMetaData::PosixStatFlags;

    data.entryFlags &= ~what;

    const QByteArray nativeFilePath = entry.nativeFilePath();
    int entryErrno = 0; // innocent until proven otherwise

    // first, we may try lstat(2). Possible outcomes:
    //  - success and is a symlink: filesystem entry exists, but we need stat(2)
    //    -> statResult = -1;
    //  - success and is not a symlink: filesystem entry exists and we're done
    //    -> statResult = 0
    //  - failure: really non-existent filesystem entry
    //    -> entryExists = false; statResult = 0;
    //    both stat(2) and lstat(2) may generate a number of different errno
    //    conditions, but of those, the only ones that could happen and the
    //    entry still exist are EACCES, EFAULT, ENOMEM and EOVERFLOW. If we get
    //    EACCES or ENOMEM, then we have no choice on how to proceed, so we may
    //    as well conclude it doesn't exist; EFAULT can't happen and EOVERFLOW
    //    shouldn't happen because we build in _LARGEFIE64.
    union {
        QT_STATBUF statBuffer;
        struct statx statxBuffer;
    };
    int statResult = -1;
    if (what & QFileSystemMetaData::LinkType) {
        mode_t mode = 0;
        statResult = qt_lstatx(nativeFilePath, &statxBuffer);
        if (statResult == -ENOSYS) {
            // use lstst(2)
            statResult = QT_LSTAT(nativeFilePath, &statBuffer);
            if (statResult == 0)
                mode = statBuffer.st_mode;
        } else if (statResult == 0) {
            statResult = 1; // record it was statx(2) that succeeded
            mode = statxBuffer.stx_mode;
        }

        if (statResult >= 0) {
            if (S_ISLNK(mode)) {
               // it's a symlink, we don't know if the file "exists"
                data.entryFlags |= QFileSystemMetaData::LinkType;
                statResult = -1;    // force stat(2) below
            } else {
                // it's a reagular file and it exists
                if (statResult)
                    data.fillFromStatxBuf(statxBuffer);
                else
                    data.fillFromStatBuf(statBuffer);
            }
        } else {
            // it doesn't exist
            entryErrno = errno;
            data.knownFlagsMask |= QFileSystemMetaData::ExistsAttribute;
        }

        data.knownFlagsMask |= QFileSystemMetaData::LinkType;
    }

    // second, we try a regular stat(2)
    if (statResult == -1 && (what & QFileSystemMetaData::PosixStatFlags)) {
        if (entryErrno == 0 && statResult == -1) {
            data.entryFlags &= ~QFileSystemMetaData::PosixStatFlags;
            statResult = qt_statx(nativeFilePath, &statxBuffer);
            if (statResult == -ENOSYS) {
                // use stat(2)
                statResult = QT_STAT(nativeFilePath, &statBuffer);
                if (statResult == 0)
                    data.fillFromStatBuf(statBuffer);
            } else if (statResult == 0) {
                data.fillFromStatxBuf(statxBuffer);
            }
        }

        if (statResult != 0) {
            entryErrno = errno;
            data.birthTime_ = 0;
            data.metadataChangeTime_ = 0;
            data.modificationTime_ = 0;
            data.accessTime_ = 0;
            data.size_ = 0;
            data.userId_ = (uint) -2;
            data.groupId_ = (uint) -2;

            // reset the mask
            data.knownFlagsMask |= QFileSystemMetaData::PosixStatFlags
                | QFileSystemMetaData::ExistsAttribute;
        }
    }

    // third, we try access(2)
    if (what & (QFileSystemMetaData::UserPermissions | QFileSystemMetaData::ExistsAttribute)) {
#if defined(Q_OS_VXWORKS)
        // on VxWorks if the filesystem is not POSIX, access() always returns false, despite the
        // file is readable
        struct statfs statBuf;
        if (statfs(nativeFilePath, &statBuf) != 0) {
            what &= ~QFileSystemMetaData::LinkType; // don't clear link: could be broken symlink
            data.clearFlags(what);
            return false;
        }
        if (statBuf.f_type != NFSV2_MAGIC && statBuf.f_type != NFSV3_MAGIC &&
            statBuf.f_type != HRFS_MAGIC) {
#if __has_include(<dosFsLib.h>)
            if (data.entryFlags & QFileSystemMetaData::OwnerWritePermission) {
                data.entryFlags |= QFileSystemMetaData::UserWritePermission;
            }
            if (data.entryFlags & QFileSystemMetaData::OwnerExecutePermission) {
                data.entryFlags |= QFileSystemMetaData::UserExecutePermission;
            }
#endif
            data.entryFlags |= QFileSystemMetaData::UserReadPermission |
                    QFileSystemMetaData::ExistsAttribute;
            return true;
        }
#endif
        // calculate user permissions
        auto checkAccess = [&](QFileSystemMetaData::MetaDataFlag flag, int mode) {
            if (entryErrno != 0 || (what & flag) == 0)
                return;
            if (QT_ACCESS(nativeFilePath, mode) == 0) {
                // access ok (and file exists)
                data.entryFlags |= flag | QFileSystemMetaData::ExistsAttribute;
            } else if (errno != EACCES && errno != EROFS) {
                entryErrno = errno;
            }
        };
        checkAccess(QFileSystemMetaData::UserReadPermission, R_OK);
        checkAccess(QFileSystemMetaData::UserWritePermission, W_OK);
        checkAccess(QFileSystemMetaData::UserExecutePermission, X_OK);

        // if we still haven't found out if the file exists, try F_OK
        if (entryErrno == 0 && (data.entryFlags & QFileSystemMetaData::ExistsAttribute) == 0) {
            if (QT_ACCESS(nativeFilePath, F_OK) == -1)
                entryErrno = errno;
            else
                data.entryFlags |= QFileSystemMetaData::ExistsAttribute;
        }

        data.knownFlagsMask |= (what & QFileSystemMetaData::UserPermissions) |
                QFileSystemMetaData::ExistsAttribute;
    }

#if defined(Q_OS_DARWIN)
    if (what & QFileSystemMetaData::AliasType) {
        if (entryErrno == 0 && hasResourcePropertyFlag(data, entry, kCFURLIsAliasFileKey)) {
            // kCFURLIsAliasFileKey includes symbolic links, so filter those out
            if (!(data.entryFlags & QFileSystemMetaData::LinkType))
                data.entryFlags |= QFileSystemMetaData::AliasType;
        }
        data.knownFlagsMask |= QFileSystemMetaData::AliasType;
    }

    if (what & QFileSystemMetaData::BundleType) {
        if (entryErrno == 0 && isPackage(data, entry))
            data.entryFlags |= QFileSystemMetaData::BundleType;

        data.knownFlagsMask |= QFileSystemMetaData::BundleType;
    }

    if (what & QFileSystemMetaData::CaseSensitive) {
        if (entryErrno == 0 && hasResourcePropertyFlag(
            data, entry, kCFURLVolumeSupportsCaseSensitiveNamesKey))
            data.entryFlags |= QFileSystemMetaData::CaseSensitive;
        data.knownFlagsMask |= QFileSystemMetaData::CaseSensitive;
    }
#endif

    if (what & QFileSystemMetaData::HiddenAttribute
            && !data.isHidden()) {
        QString fileName = entry.fileName();
        if (fileName.startsWith(u'.')
#if defined(Q_OS_DARWIN)
                || (entryErrno == 0 && hasResourcePropertyFlag(data, entry, kCFURLIsHiddenKey))
#endif
                )
            data.entryFlags |= QFileSystemMetaData::HiddenAttribute;
        data.knownFlagsMask |= QFileSystemMetaData::HiddenAttribute;
    }

    if (entryErrno != 0) {
        what &= ~QFileSystemMetaData::LinkType; // don't clear link: could be broken symlink
        data.clearFlags(what);
        return false;
    }
    return true;
}